

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  uint uVar2;
  MElementType MVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  TPZGeoElSide me;
  int64_t index;
  TPZManVector<long,_10> nodeindices;
  TPZGeoElSide newelside;
  TPZGeoElSide local_d0;
  undefined1 local_b8 [8];
  TPZManVector<long,_10> local_b0;
  TPZGeoElSide local_40;
  TPZGeoEl *pTVar6;
  
  uVar2 = pztopology::TPZTriangle::NSideNodes(side);
  TPZManVector<long,_10>::TPZManVector(&local_b0,(long)(int)uVar2);
  uVar7 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    lVar5 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar7 & 0xffffffff);
    local_b0.super_TPZVec<long>.fStore[uVar7] = lVar5;
  }
  pTVar1 = (this->super_TPZGeoEl).fMesh;
  MVar3 = pztopology::TPZTriangle::Type(side);
  iVar4 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar1,(ulong)MVar3,&local_b0,(ulong)(uint)bc,local_b8);
  pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
  local_d0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_d0.fGeoEl = &this->super_TPZGeoEl;
  local_d0.fSide = side;
  local_40.fSide = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
  local_40.fSide = local_40.fSide + -1;
  local_40.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_40.fGeoEl = pTVar6;
  TPZGeoElSide::InsertConnectivity(&local_40,&local_d0);
  (**(code **)(*(long *)pTVar6 + 0x78))(pTVar6);
  TPZManVector<long,_10>::~TPZManVector(&local_b0);
  return pTVar6;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc)
{
	int sidennodes = TGeo::NSideNodes(side);
	TPZManVector<int64_t> nodeindices(sidennodes);
	int inode;
	for(inode=0; inode<sidennodes; inode++){
		nodeindices[inode] = this->SideNodeIndex(side,inode);
	}
	int64_t index;
	
	TPZGeoMesh *mesh = this->Mesh();
	MElementType BCtype = TGeo::Type(side);
	
	TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
	TPZGeoElSide me(this,side);
	TPZGeoElSide newelside(newel,newel->NSides()-1);
	
	newelside.InsertConnectivity(me);
	newel->Initialize();
	
	return newel;
}